

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O3

int Abc_NtkMfsEdgePower(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  long lVar4;
  
  if (0 < (pNode->vFanins).nSize) {
    lVar4 = 0;
    do {
      pVVar2 = p->vProbs;
      if (pVVar2 != (Vec_Int_t *)0x0) {
        uVar1 = *(uint *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar4]] + 0x10);
        if ((int)uVar1 < pVVar2->nSize) {
          if ((int)uVar1 < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (0.35 <= (float)pVVar2->pArray[uVar1]) {
            iVar3 = Abc_NtkMfsSolveSatResub(p,pNode,(int)lVar4,0,0);
            if (iVar3 != 0) {
              return 1;
            }
          }
          else if ((0.25 <= (float)pVVar2->pArray[uVar1]) &&
                  (iVar3 = Abc_NtkMfsSolveSatResub(p,pNode,(int)lVar4,1,0), iVar3 != 0)) {
            return 1;
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pNode->vFanins).nSize);
  }
  return 0;
}

Assistant:

int Abc_NtkMfsEdgePower( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i;
    // try replacing area critical fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
	{
        if ( Abc_MfsObjProb(p, pFanin) >= 0.35 )
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                return 1;
        } else if ( Abc_MfsObjProb(p, pFanin) >= 0.25 ) // sjang
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 1, 0 ) )
                return 1;
        }
        }
    return 0;
}